

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O1

size_t __thiscall
Fossilize::ConcurrentDatabase::compute_exported_metadata_size(ConcurrentDatabase *this)

{
  DatabaseInterface *pDVar1;
  pointer puVar2;
  int iVar3;
  size_t sVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint i;
  uint uVar5;
  size_t sVar6;
  size_t count;
  long lVar7;
  pointer puVar8;
  
  sVar6 = 0;
  if (this->mode == ReadOnly) {
    lVar7 = 0;
    do {
      sVar4 = get_total_num_hashes_for_tag(this,(ResourceTag)sVar6);
      lVar7 = lVar7 + sVar4;
      uVar5 = (ResourceTag)sVar6 + RESOURCE_SAMPLER;
      sVar6 = (size_t)uVar5;
    } while (uVar5 != 10);
    pDVar1 = (this->readonly_interface)._M_t.
             super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
             ._M_t.
             super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
             .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
    if (pDVar1 == (DatabaseInterface *)0x0) {
      sVar6 = lVar7 * 8 + 0x160;
    }
    else {
      iVar3 = (*pDVar1->_vptr_DatabaseInterface[0xb])();
      sVar6 = lVar7 * 8 + CONCAT44(extraout_var,iVar3) + 0xb0;
    }
    puVar2 = (this->extra_readonly).
             super__Vector_base<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>,_std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar8 = (this->extra_readonly).
                  super__Vector_base<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>,_std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; puVar8 != puVar2; puVar8 = puVar8 + 1)
    {
      pDVar1 = (puVar8->_M_t).
               super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
               ._M_t.
               super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
               .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
      if (pDVar1 == (DatabaseInterface *)0x0) {
        lVar7 = 0xb0;
      }
      else {
        iVar3 = (*pDVar1->_vptr_DatabaseInterface[0xb])();
        lVar7 = CONCAT44(extraout_var_00,iVar3);
      }
      sVar6 = sVar6 + lVar7;
    }
  }
  return sVar6;
}

Assistant:

size_t compute_exported_metadata_size() const override
	{
		if (mode != DatabaseMode::ReadOnly)
			return 0;

		size_t size = 0;

		size += sizeof(ExportedMetadataHeader) + get_total_num_hashes() * sizeof(ExportedMetadataConcurrentPrimedBlock);

		if (readonly_interface)
			size += readonly_interface->compute_exported_metadata_size();
		else
			size += sizeof(ExportedMetadataHeader);

		for (auto &e : extra_readonly)
		{
			if (e)
				size += e->compute_exported_metadata_size();
			else
				size += sizeof(ExportedMetadataHeader);
		}

		return size;
	}